

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int main(int argc,char **argv)

{
  int status_00;
  int iVar1;
  lua_State *L_00;
  lua_State *L;
  int result;
  int status;
  char **argv_local;
  int argc_local;
  
  L_00 = luaL_newstate();
  if (L_00 == (lua_State *)0x0) {
    l_message(*argv,"cannot create state: not enough memory");
    argv_local._4_4_ = 1;
  }
  else {
    lua_pushcclosure(L_00,pmain,0);
    lua_pushinteger(L_00,(long)argc);
    lua_pushlightuserdata(L_00,argv);
    status_00 = lua_pcallk(L_00,2,1,0,0,(lua_KFunction)0x0);
    iVar1 = lua_toboolean(L_00,-1);
    report(L_00,status_00);
    lua_close(L_00);
    argv_local._4_4_ = (uint)(iVar1 == 0 || status_00 != 0);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    int status, result;
    lua_State *L = luaL_newstate();  /* create state */
    if (L == NULL) {
        l_message(argv[0], "cannot create state: not enough memory");
        return EXIT_FAILURE;
    }
    lua_pushcfunction(L, &pmain);  /* to call 'pmain' in protected mode */
    lua_pushinteger(L, argc);  /* 1st argument */
    lua_pushlightuserdata(L, argv); /* 2nd argument */
    status = lua_pcall(L, 2, 1, 0);  /* do the call */
    result = lua_toboolean(L, -1);  /* get result */
    report(L, status);
    lua_close(L);
    return (result && status == LUA_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
}